

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_global_reinit(void)

{
  uv__close(uv__signal_lock_pipefd[0]);
  uv__signal_lock_pipefd[0] = -1;
  uv__close(uv__signal_lock_pipefd[1]);
  uv__signal_lock_pipefd[1] = -1;
  uv__signal_global_init();
  return;
}

Assistant:

static void uv__signal_global_reinit(void) {
  /* We can only use signal-safe functions here.
   * That includes read/write and close, fortunately.
   * We do all of this directly here instead of resetting
   * uv__signal_global_init_guard because
   * uv__signal_global_once_init is only called from uv_loop_init
   * and this needs to function in existing loops.
   */
  uv__close(uv__signal_lock_pipefd[0]);
  uv__signal_lock_pipefd[0] = -1;
  uv__close(uv__signal_lock_pipefd[1]);
  uv__signal_lock_pipefd[1] = -1;
  uv__signal_global_init();
}